

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDbvt.h
# Opt level: O3

void __thiscall btDbvt::collideTV(btDbvt *this,btDbvtNode *root,btDbvtVolume *vol,ICollide *policy)

{
  btDbvtNode *pbVar1;
  int iVar2;
  uint uVar3;
  btDbvtNode **ppbVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  btAlignedObjectArray<const_btDbvtNode_*> bStack_68;
  btScalar local_48;
  btScalar local_44;
  btScalar local_40;
  btScalar local_3c;
  btScalar local_38;
  btScalar local_34;
  
  if (root != (btDbvtNode *)0x0) {
    local_38 = (vol->mi).m_floats[0];
    local_40 = (vol->mi).m_floats[1];
    local_48 = (vol->mi).m_floats[2];
    local_34 = (vol->mx).m_floats[0];
    local_3c = (vol->mx).m_floats[1];
    local_44 = (vol->mx).m_floats[2];
    bStack_68.m_ownsMemory = true;
    bStack_68.m_data = (btDbvtNode **)0x0;
    bStack_68.m_size = 0;
    bStack_68.m_capacity = 0;
    ppbVar4 = (btDbvtNode **)btAlignedAllocInternal(0x200,0x10);
    if (0 < (long)bStack_68.m_size) {
      lVar5 = 0;
      do {
        ppbVar4[lVar5] = bStack_68.m_data[lVar5];
        lVar5 = lVar5 + 1;
      } while (bStack_68.m_size != lVar5);
    }
    iVar2 = bStack_68.m_size;
    if ((bStack_68.m_data != (btDbvtNode **)0x0) && (bStack_68.m_ownsMemory == true)) {
      btAlignedFreeInternal(bStack_68.m_data);
      iVar2 = bStack_68.m_size;
    }
    bStack_68.m_ownsMemory = true;
    bStack_68.m_capacity = 0x40;
    if (iVar2 == 0x40) {
      bStack_68.m_data = ppbVar4;
      ppbVar4 = (btDbvtNode **)btAlignedAllocInternal(0x400,0x10);
      if (0 < (long)bStack_68.m_size) {
        lVar5 = 0;
        do {
          ppbVar4[lVar5] = bStack_68.m_data[lVar5];
          lVar5 = lVar5 + 1;
        } while (bStack_68.m_size != lVar5);
      }
      iVar2 = bStack_68.m_size;
      if ((bStack_68.m_data != (btDbvtNode **)0x0) && (bStack_68.m_ownsMemory == true)) {
        btAlignedFreeInternal(bStack_68.m_data);
        iVar2 = bStack_68.m_size;
      }
      bStack_68.m_capacity = 0x80;
    }
    bStack_68.m_ownsMemory = true;
    ppbVar4[iVar2] = root;
    bStack_68.m_size = iVar2 + 1;
    bStack_68.m_data = ppbVar4;
    do {
      uVar3 = bStack_68.m_size - 1;
      pbVar1 = bStack_68.m_data[(long)bStack_68.m_size + -1];
      if ((((((pbVar1->volume).mi.m_floats[0] <= local_34) &&
            (local_38 <= (pbVar1->volume).mx.m_floats[0])) &&
           ((pbVar1->volume).mi.m_floats[1] <= local_3c)) &&
          ((local_40 <= (pbVar1->volume).mx.m_floats[1] &&
           ((pbVar1->volume).mi.m_floats[2] <= local_44)))) &&
         (local_48 <= (pbVar1->volume).mx.m_floats[2])) {
        if ((pbVar1->field_2).childs[1] == (btDbvtNode *)0x0) {
          bStack_68.m_size = uVar3;
          (*policy->_vptr_ICollide[3])(policy,pbVar1);
          uVar3 = bStack_68.m_size;
        }
        else {
          lVar5 = (long)bStack_68.m_size + -1;
          uVar7 = bStack_68.m_capacity;
          if (uVar3 == bStack_68.m_capacity) {
            uVar7 = uVar3 * 2;
            if (uVar3 == 0) {
              uVar7 = 1;
            }
            if (bStack_68.m_size <= (int)uVar7) {
              if (uVar7 == 0) {
                ppbVar4 = (btDbvtNode **)0x0;
                bStack_68.m_size = uVar3;
              }
              else {
                bStack_68.m_size = uVar3;
                ppbVar4 = (btDbvtNode **)btAlignedAllocInternal((long)(int)uVar7 << 3,0x10);
              }
              if (0 < bStack_68.m_size) {
                uVar6 = 0;
                do {
                  ppbVar4[uVar6] = bStack_68.m_data[uVar6];
                  uVar6 = uVar6 + 1;
                } while ((uint)bStack_68.m_size != uVar6);
              }
              if ((bStack_68.m_data != (btDbvtNode **)0x0) && (bStack_68.m_ownsMemory == true)) {
                btAlignedFreeInternal(bStack_68.m_data);
              }
              bStack_68.m_ownsMemory = true;
              lVar5 = (long)bStack_68.m_size;
              bStack_68.m_size = bStack_68.m_size + 1;
              bStack_68.m_data = ppbVar4;
              goto LAB_00135e08;
            }
            bStack_68.m_data[lVar5] = (pbVar1->field_2).childs[0];
            uVar3 = bStack_68.m_size;
          }
          else {
LAB_00135e08:
            bStack_68.m_data[lVar5] = (pbVar1->field_2).childs[0];
            uVar3 = bStack_68.m_size;
            bStack_68.m_capacity = uVar7;
            if (bStack_68.m_size == uVar7) {
              uVar8 = uVar7 * 2;
              if (uVar7 == 0) {
                uVar8 = 1;
              }
              uVar3 = uVar7;
              if ((int)uVar7 < (int)uVar8) {
                if (uVar8 == 0) {
                  ppbVar4 = (btDbvtNode **)0x0;
                }
                else {
                  ppbVar4 = (btDbvtNode **)btAlignedAllocInternal((long)(int)uVar8 << 3,0x10);
                  uVar7 = bStack_68.m_size;
                }
                if (0 < (int)uVar7) {
                  uVar6 = 0;
                  do {
                    ppbVar4[uVar6] = bStack_68.m_data[uVar6];
                    uVar6 = uVar6 + 1;
                  } while (uVar7 != uVar6);
                }
                uVar3 = uVar7;
                if ((bStack_68.m_data != (btDbvtNode **)0x0) && (bStack_68.m_ownsMemory == true)) {
                  btAlignedFreeInternal(bStack_68.m_data);
                  uVar3 = bStack_68.m_size;
                }
                bStack_68.m_ownsMemory = true;
                bStack_68.m_data = ppbVar4;
                bStack_68.m_capacity = uVar8;
              }
            }
          }
          bStack_68.m_data[(int)uVar3] = (pbVar1->field_2).childs[1];
          uVar3 = uVar3 + 1;
        }
      }
      bStack_68.m_size = uVar3;
    } while (0 < bStack_68.m_size);
    btAlignedObjectArray<const_btDbvtNode_*>::~btAlignedObjectArray(&bStack_68);
  }
  return;
}

Assistant:

DBVT_PREFIX
inline void		btDbvt::collideTV(	const btDbvtNode* root,
								  const btDbvtVolume& vol,
								  DBVT_IPOLICY) const
{
	DBVT_CHECKTYPE
		if(root)
		{
			ATTRIBUTE_ALIGNED16(btDbvtVolume)		volume(vol);
			btAlignedObjectArray<const btDbvtNode*>	stack;
			stack.resize(0);
			stack.reserve(SIMPLE_STACKSIZE);
			stack.push_back(root);
			do	{
				const btDbvtNode*	n=stack[stack.size()-1];
				stack.pop_back();
				if(Intersect(n->volume,volume))
				{
					if(n->isinternal())
					{
						stack.push_back(n->childs[0]);
						stack.push_back(n->childs[1]);
					}
					else
					{
						policy.Process(n);
					}
				}
			} while(stack.size()>0);
		}
}